

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

Expression *
slang::ast::Expression::bindAssignmentPattern
          (Compilation *comp,AssignmentPatternExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SymbolKind SVar1;
  SyntaxKind SVar2;
  SyntaxNode *this;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange sourceRange_03;
  SourceRange sourceRange_04;
  SourceRange sourceRange_05;
  SourceRange sourceRange_06;
  SourceRange sourceRange_07;
  SourceRange sourceRange_08;
  Compilation *comp_00;
  bool bVar3;
  bitwidth_t bVar4;
  int iVar5;
  Type *pTVar7;
  Type *elementType;
  SimpleAssignmentPatternSyntax *pSVar8;
  StructuredAssignmentPatternSyntax *pSVar9;
  ReplicatedAssignmentPatternSyntax *pRVar10;
  Compilation *pCVar11;
  Diagnostic *diag;
  Expression *pEVar12;
  logic_error *plVar13;
  long *plVar14;
  size_type *psVar15;
  long *plVar16;
  DiagCode code;
  FixedSizeUnpackedArrayType *ua;
  int iVar18;
  Type *structScope;
  SourceRange SVar19;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Compilation *local_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  SourceLocation local_d0;
  SourceLocation SStack_c8;
  SourceLocation local_c0;
  SourceLocation SStack_b8;
  SourceLocation local_b0;
  SourceLocation SStack_a8;
  SourceLocation local_a0;
  SourceLocation SStack_98;
  SourceLocation local_90;
  SourceLocation SStack_88;
  SourceLocation local_80;
  SourceLocation SStack_78;
  SourceLocation local_70;
  SourceLocation SStack_68;
  SourceLocation local_60;
  SourceLocation SStack_58;
  SourceLocation local_50;
  SourceLocation SStack_48;
  SourceLocation local_40;
  SourceLocation SStack_38;
  SourceLocation SVar6;
  SourceLocation SVar17;
  
  SVar19 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  SVar17 = SVar19.endLoc;
  SVar6 = SVar19.startLoc;
  if (syntax->type == (DataTypeSyntax *)0x0) {
    if (assignmentTarget != (Type *)0x0) goto LAB_003a81ba;
    SVar19 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    code.subsystem = Expressions;
    code.code = 0x14;
    goto LAB_003a8496;
  }
  assignmentTarget = Compilation::getType(comp,syntax->type,context,(Type *)0x0);
  bVar3 = Type::isSimpleType(assignmentTarget);
  if ((!bVar3) && ((syntax->type->super_ExpressionSyntax).super_SyntaxNode.kind != TypeReference)) {
    pTVar7 = assignmentTarget->canonical;
    if (pTVar7 == (Type *)0x0) {
      Type::resolveCanonical(assignmentTarget);
      pTVar7 = assignmentTarget->canonical;
    }
    if ((pTVar7->super_Symbol).kind == ErrorType) goto LAB_003a8529;
LAB_003a8516:
    diag = ASTContext::addDiag(context,(DiagCode)0x1c0007,SVar19);
    ast::operator<<(diag,assignmentTarget);
    goto LAB_003a8529;
  }
LAB_003a81ba:
  pTVar7 = assignmentTarget->canonical;
  if (pTVar7 == (Type *)0x0) {
    Type::resolveCanonical(assignmentTarget);
    pTVar7 = assignmentTarget->canonical;
  }
  SVar1 = (pTVar7->super_Symbol).kind;
  switch(SVar1) {
  case PackedArrayType:
    elementType = (Type *)pTVar7[1].super_Symbol.name._M_len;
    iVar5 = *(int *)&pTVar7[1].super_Symbol.name._M_str -
            *(int *)((long)&pTVar7[1].super_Symbol.name._M_str + 4);
    goto LAB_003a829f;
  case FixedSizeUnpackedArrayType:
    elementType = *(Type **)&pTVar7[1].super_Symbol;
    iVar5 = (int)pTVar7[1].super_Symbol.name._M_len -
            *(int *)((long)&pTVar7[1].super_Symbol.name._M_len + 4);
LAB_003a829f:
    iVar18 = -iVar5;
    if (0 < iVar5) {
      iVar18 = iVar5;
    }
    bVar4 = iVar18 + 1;
    local_138 = comp;
    break;
  case DynamicArrayType:
  case AssociativeArrayType:
  case QueueType:
    local_138 = comp;
    elementType = Type::getArrayElementType(pTVar7);
    bVar4 = 0;
    break;
  case PackedStructType:
    structScope = (Type *)&pTVar7[1].super_Symbol.name;
    goto LAB_003a82bd;
  case UnpackedStructType:
    structScope = pTVar7 + 1;
LAB_003a82bd:
    bVar4 = 0;
    elementType = (Type *)0x0;
    local_138 = comp;
    goto LAB_003a82c2;
  default:
    if (SVar1 == ErrorType) goto LAB_003a8529;
    bVar3 = Type::isIntegral(pTVar7);
    if ((!bVar3) || ((pTVar7->super_Symbol).kind == ScalarType)) goto LAB_003a8516;
    bVar3 = Type::isFourState(pTVar7);
    elementType = comp->scalarTypeTable[(ulong)bVar3 + 8];
    local_138 = comp;
    bVar4 = Type::getBitWidth(pTVar7);
  }
  structScope = (Type *)0x0;
LAB_003a82c2:
  comp_00 = local_138;
  this = &((syntax->pattern).ptr)->super_SyntaxNode;
  if (this == (SyntaxNode *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::AssignmentPatternSyntax *>::get() const [T = slang::syntax::AssignmentPatternSyntax *]"
              );
  }
  if (structScope == (Type *)0x0) {
    SVar1 = (pTVar7->super_Symbol).kind;
    if (SVar1 != QueueType) {
      if (SVar1 == AssociativeArrayType) {
        SVar2 = this->kind;
        if (SVar2 != ReplicatedAssignmentPattern) {
          if (SVar2 == StructuredAssignmentPattern) {
            pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                               (this);
            sourceRange_05.endLoc = SVar17;
            sourceRange_05.startLoc = SVar6;
            local_a0 = SVar6;
            SStack_98 = SVar17;
            pEVar12 = StructuredAssignmentPatternExpression::forAssociativeArray
                                (comp_00,pSVar9,context,assignmentTarget,elementType,sourceRange_05)
            ;
            return pEVar12;
          }
          if (SVar2 != SimpleAssignmentPattern) {
            plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
            local_178[0] = local_168;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_178,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                       ,"");
            plVar14 = (long *)std::__cxx11::string::append((char *)local_178);
            local_158._M_dataplus._M_p = (pointer)*plVar14;
            psVar15 = (size_type *)(plVar14 + 2);
            if ((size_type *)local_158._M_dataplus._M_p == psVar15) {
              local_158.field_2._M_allocated_capacity = *psVar15;
              local_158.field_2._8_8_ = plVar14[3];
              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
            }
            else {
              local_158.field_2._M_allocated_capacity = *psVar15;
            }
            local_158._M_string_length = plVar14[1];
            *plVar14 = (long)psVar15;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            std::__cxx11::to_string(&local_110,0x479);
            std::operator+(&local_f0,&local_158,&local_110);
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_f0);
            local_130 = (long *)*plVar14;
            plVar16 = plVar14 + 2;
            if (local_130 == plVar16) {
              local_120 = *plVar16;
              lStack_118 = plVar14[3];
              local_130 = &local_120;
            }
            else {
              local_120 = *plVar16;
            }
            local_128 = plVar14[1];
            *plVar14 = (long)plVar16;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_130);
            local_198 = (long *)*plVar14;
            plVar16 = plVar14 + 2;
            if (local_198 == plVar16) {
              local_188 = *plVar16;
              lStack_180 = plVar14[3];
              local_198 = &local_188;
            }
            else {
              local_188 = *plVar16;
            }
            local_190 = plVar14[1];
            *plVar14 = (long)plVar16;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            std::logic_error::logic_error(plVar13,(string *)&local_198);
            __cxa_throw(plVar13,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
        }
        code.subsystem = Expressions;
        code.code = 0xc;
        SVar19.endLoc = SVar17;
        SVar19.startLoc = SVar6;
        comp = local_138;
LAB_003a8496:
        ASTContext::addDiag(context,code,SVar19);
LAB_003a8529:
        pEVar12 = badExpr(comp,(Expression *)0x0);
        return pEVar12;
      }
      if (SVar1 != DynamicArrayType) {
        SVar2 = this->kind;
        if (SVar2 == ReplicatedAssignmentPattern) {
          pCVar11 = (Compilation *)
                    slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                              (this);
          sourceRange_08.endLoc = SVar17;
          sourceRange_08.startLoc = SVar17;
          local_d0 = SVar6;
          SStack_c8 = SVar17;
          pEVar12 = ReplicatedAssignmentPatternExpression::forFixedArray
                              ((ReplicatedAssignmentPatternExpression *)comp_00,pCVar11,
                               (ReplicatedAssignmentPatternSyntax *)context,
                               (ASTContext *)assignmentTarget,elementType,(Type *)(ulong)bVar4,
                               SVar19.startLoc._0_4_,sourceRange_08);
          return pEVar12;
        }
        if (SVar2 != StructuredAssignmentPattern) {
          if (SVar2 == SimpleAssignmentPattern) {
            pCVar11 = (Compilation *)
                      slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>
                                (this);
            sourceRange_07.endLoc = SVar17;
            sourceRange_07.startLoc = SVar17;
            local_b0 = SVar6;
            SStack_a8 = SVar17;
            pEVar12 = SimpleAssignmentPatternExpression::forFixedArray
                                ((SimpleAssignmentPatternExpression *)comp_00,pCVar11,
                                 (SimpleAssignmentPatternSyntax *)context,
                                 (ASTContext *)assignmentTarget,elementType,(Type *)(ulong)bVar4,
                                 SVar19.startLoc._0_4_,sourceRange_07);
            return pEVar12;
          }
          plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
          local_178[0] = local_168;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_178,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                     ,"");
          plVar14 = (long *)std::__cxx11::string::append((char *)local_178);
          local_158._M_dataplus._M_p = (pointer)*plVar14;
          psVar15 = (size_type *)(plVar14 + 2);
          if ((size_type *)local_158._M_dataplus._M_p == psVar15) {
            local_158.field_2._M_allocated_capacity = *psVar15;
            local_158.field_2._8_8_ = plVar14[3];
            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *psVar15;
          }
          local_158._M_string_length = plVar14[1];
          *plVar14 = (long)psVar15;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::__cxx11::to_string(&local_110,0x48b);
          std::operator+(&local_f0,&local_158,&local_110);
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_130 = (long *)*plVar14;
          plVar16 = plVar14 + 2;
          if (local_130 == plVar16) {
            local_120 = *plVar16;
            lStack_118 = plVar14[3];
            local_130 = &local_120;
          }
          else {
            local_120 = *plVar16;
          }
          local_128 = plVar14[1];
          *plVar14 = (long)plVar16;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          plVar14 = (long *)std::__cxx11::string::append((char *)&local_130);
          local_198 = (long *)*plVar14;
          plVar16 = plVar14 + 2;
          if (local_198 == plVar16) {
            local_188 = *plVar16;
            lStack_180 = plVar14[3];
            local_198 = &local_188;
          }
          else {
            local_188 = *plVar16;
          }
          local_190 = plVar14[1];
          *plVar14 = (long)plVar16;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          std::logic_error::logic_error(plVar13,(string *)&local_198);
          __cxa_throw(plVar13,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>
                           (this);
        sourceRange_06.endLoc = SVar17;
        sourceRange_06.startLoc = SVar6;
        local_c0 = SVar6;
        SStack_b8 = SVar17;
        pEVar12 = StructuredAssignmentPatternExpression::forFixedArray
                            (comp_00,pSVar9,context,assignmentTarget,elementType,sourceRange_06);
        return pEVar12;
      }
    }
    SVar2 = this->kind;
    if (SVar2 == ReplicatedAssignmentPattern) {
      pRVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                          (this);
      sourceRange_04.endLoc = SVar17;
      sourceRange_04.startLoc = SVar6;
      local_90 = SVar6;
      SStack_88 = SVar17;
      pEVar12 = ReplicatedAssignmentPatternExpression::forDynamicArray
                          (comp_00,pRVar10,context,assignmentTarget,elementType,sourceRange_04);
    }
    else if (SVar2 == StructuredAssignmentPattern) {
      pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>(this)
      ;
      sourceRange_03.endLoc = SVar17;
      sourceRange_03.startLoc = SVar6;
      local_80 = SVar6;
      SStack_78 = SVar17;
      pEVar12 = StructuredAssignmentPatternExpression::forDynamicArray
                          (comp_00,pSVar9,context,assignmentTarget,elementType,sourceRange_03);
    }
    else {
      if (SVar2 != SimpleAssignmentPattern) {
        plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
        local_178[0] = local_168;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                   ,"");
        plVar14 = (long *)std::__cxx11::string::append((char *)local_178);
        local_158._M_dataplus._M_p = (pointer)*plVar14;
        psVar15 = (size_type *)(plVar14 + 2);
        if ((size_type *)local_158._M_dataplus._M_p == psVar15) {
          local_158.field_2._M_allocated_capacity = *psVar15;
          local_158.field_2._8_8_ = plVar14[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar15;
        }
        local_158._M_string_length = plVar14[1];
        *plVar14 = (long)psVar15;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::to_string(&local_110,0x46b);
        std::operator+(&local_f0,&local_158,&local_110);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_130 = (long *)*plVar14;
        plVar16 = plVar14 + 2;
        if (local_130 == plVar16) {
          local_120 = *plVar16;
          lStack_118 = plVar14[3];
          local_130 = &local_120;
        }
        else {
          local_120 = *plVar16;
        }
        local_128 = plVar14[1];
        *plVar14 = (long)plVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_198 = (long *)*plVar14;
        plVar16 = plVar14 + 2;
        if (local_198 == plVar16) {
          local_188 = *plVar16;
          lStack_180 = plVar14[3];
          local_198 = &local_188;
        }
        else {
          local_188 = *plVar16;
        }
        local_190 = plVar14[1];
        *plVar14 = (long)plVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::logic_error::logic_error(plVar13,(string *)&local_198);
        __cxa_throw(plVar13,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pSVar8 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>(this);
      sourceRange_00.endLoc = SVar17;
      sourceRange_00.startLoc = SVar6;
      local_70 = SVar6;
      SStack_68 = SVar17;
      pEVar12 = SimpleAssignmentPatternExpression::forDynamicArray
                          (comp_00,pSVar8,context,assignmentTarget,elementType,sourceRange_00);
    }
  }
  else {
    SVar2 = this->kind;
    if (SVar2 == ReplicatedAssignmentPattern) {
      pRVar10 = slang::syntax::SyntaxNode::as<slang::syntax::ReplicatedAssignmentPatternSyntax>
                          (this);
      sourceRange_02.endLoc = SVar17;
      sourceRange_02.startLoc = SVar6;
      local_60 = SVar6;
      SStack_58 = SVar17;
      pEVar12 = ReplicatedAssignmentPatternExpression::forStruct
                          (local_138,pRVar10,context,assignmentTarget,(Scope *)structScope,
                           sourceRange_02);
    }
    else if (SVar2 == StructuredAssignmentPattern) {
      pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StructuredAssignmentPatternSyntax>(this)
      ;
      sourceRange_01.endLoc = SVar17;
      sourceRange_01.startLoc = SVar6;
      local_50 = SVar6;
      SStack_48 = SVar17;
      pEVar12 = StructuredAssignmentPatternExpression::forStruct
                          (local_138,pSVar9,context,assignmentTarget,(Scope *)structScope,
                           sourceRange_01);
    }
    else {
      if (SVar2 != SimpleAssignmentPattern) {
        plVar13 = (logic_error *)__cxa_allocate_exception(0x10);
        local_178[0] = local_168;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                   ,"");
        plVar14 = (long *)std::__cxx11::string::append((char *)local_178);
        local_158._M_dataplus._M_p = (pointer)*plVar14;
        psVar15 = (size_type *)(plVar14 + 2);
        if ((size_type *)local_158._M_dataplus._M_p == psVar15) {
          local_158.field_2._M_allocated_capacity = *psVar15;
          local_158.field_2._8_8_ = plVar14[3];
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        }
        else {
          local_158.field_2._M_allocated_capacity = *psVar15;
        }
        local_158._M_string_length = plVar14[1];
        *plVar14 = (long)psVar15;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::to_string(&local_110,0x459);
        std::operator+(&local_f0,&local_158,&local_110);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_f0);
        local_130 = (long *)*plVar14;
        plVar16 = plVar14 + 2;
        if (local_130 == plVar16) {
          local_120 = *plVar16;
          lStack_118 = plVar14[3];
          local_130 = &local_120;
        }
        else {
          local_120 = *plVar16;
        }
        local_128 = plVar14[1];
        *plVar14 = (long)plVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_130);
        local_198 = (long *)*plVar14;
        plVar16 = plVar14 + 2;
        if (local_198 == plVar16) {
          local_188 = *plVar16;
          lStack_180 = plVar14[3];
          local_198 = &local_188;
        }
        else {
          local_188 = *plVar16;
        }
        local_190 = plVar14[1];
        *plVar14 = (long)plVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::logic_error::logic_error(plVar13,(string *)&local_198);
        __cxa_throw(plVar13,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pSVar8 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleAssignmentPatternSyntax>(this);
      sourceRange.endLoc = SVar17;
      sourceRange.startLoc = SVar6;
      local_40 = SVar6;
      SStack_38 = SVar17;
      pEVar12 = SimpleAssignmentPatternExpression::forStruct
                          (local_138,pSVar8,context,assignmentTarget,(Scope *)structScope,
                           sourceRange);
    }
  }
  return pEVar12;
}

Assistant:

Expression& Expression::bindAssignmentPattern(Compilation& comp,
                                              const AssignmentPatternExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    SourceRange range = syntax.sourceRange();

    if (syntax.type) {
        assignmentTarget = &comp.getType(*syntax.type, context);
        if (!assignmentTarget->isSimpleType() && syntax.type->kind != SyntaxKind::TypeReference) {
            if (!assignmentTarget->isError())
                context.addDiag(diag::BadAssignmentPatternType, range) << *assignmentTarget;
            return badExpr(comp, nullptr);
        }
    }

    if (!assignmentTarget || assignmentTarget->isError()) {
        if (!assignmentTarget)
            context.addDiag(diag::AssignmentPatternNoContext, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    const Type& type = *assignmentTarget;
    const Scope* structScope = nullptr;
    const Type* elementType = nullptr;
    bitwidth_t numElements = 0;

    auto& ct = type.getCanonicalType();
    if (ct.kind == SymbolKind::PackedStructType) {
        structScope = &ct.as<PackedStructType>();
    }
    else if (ct.kind == SymbolKind::UnpackedStructType) {
        structScope = &ct.as<UnpackedStructType>();
    }
    else if (ct.kind == SymbolKind::PackedArrayType) {
        auto& ua = ct.as<PackedArrayType>();
        elementType = &ua.elementType;
        numElements = ua.range.width();
    }
    else if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
        auto& ua = ct.as<FixedSizeUnpackedArrayType>();
        elementType = &ua.elementType;
        numElements = ua.range.width();
    }
    else if (ct.kind == SymbolKind::DynamicArrayType ||
             ct.kind == SymbolKind::AssociativeArrayType || ct.kind == SymbolKind::QueueType) {
        elementType = ct.getArrayElementType();
    }
    else if (ct.isIntegral() && ct.kind != SymbolKind::ScalarType) {
        elementType = ct.isFourState() ? &comp.getLogicType() : &comp.getBitType();
        numElements = ct.getBitWidth();
    }
    else {
        context.addDiag(diag::BadAssignmentPatternType, range) << type;
        return badExpr(comp, nullptr);
    }

    const AssignmentPatternSyntax& p = *syntax.pattern;
    if (structScope) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forStruct(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forStruct(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forStruct(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *structScope,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else if (ct.kind == SymbolKind::DynamicArrayType || ct.kind == SymbolKind::QueueType) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forDynamicArray(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else if (ct.kind == SymbolKind::AssociativeArrayType) {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
            case SyntaxKind::ReplicatedAssignmentPattern:
                context.addDiag(diag::AssignmentPatternAssociativeType, range);
                return badExpr(comp, nullptr);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forAssociativeArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
    else {
        switch (p.kind) {
            case SyntaxKind::SimpleAssignmentPattern:
                return SimpleAssignmentPatternExpression::forFixedArray(
                    comp, p.as<SimpleAssignmentPatternSyntax>(), context, type, *elementType,
                    numElements, range);
            case SyntaxKind::StructuredAssignmentPattern:
                return StructuredAssignmentPatternExpression::forFixedArray(
                    comp, p.as<StructuredAssignmentPatternSyntax>(), context, type, *elementType,
                    range);
            case SyntaxKind::ReplicatedAssignmentPattern:
                return ReplicatedAssignmentPatternExpression::forFixedArray(
                    comp, p.as<ReplicatedAssignmentPatternSyntax>(), context, type, *elementType,
                    numElements, range);
            default:
                ASSUME_UNREACHABLE;
        }
    }
}